

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O1

void __thiscall Gc_Nothing_Test::TestBody(Gc_Nothing_Test *this)

{
  TypedExpectation<int_(std::initializer_list<const_char_*>)> *this_00;
  TypedExpectation<void_(const_int_&)> *this_01;
  thread thread;
  test_watch_thread gc;
  MatcherBase<const_int_&> local_190;
  MockSpec<void_(const_int_&)> local_178;
  test_watch_thread local_158;
  
  anon_unknown.dwarf_5c0ec::test_watch_thread::test_watch_thread(&local_158);
  local_190.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::initializer_list<char_const*>>::
       GetVTable<testing::internal::MatcherBase<std::initializer_list<char_const*>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_190.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001982f0;
  anon_unknown.dwarf_5c0ec::test_watch_thread::gmock_spawn
            ((MockSpec<int_(std::initializer_list<const_char_*>)> *)&local_178,&local_158,
             (Matcher<std::initializer_list<const_char_*>_> *)&local_190);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<int_(std::initializer_list<const_char_*>)>::
            InternalExpectedAt((MockSpec<int_(std::initializer_list<const_char_*>)> *)&local_178,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                               ,0x98,"gc","spawn (_)");
  testing::internal::TypedExpectation<int_(std::initializer_list<const_char_*>)>::Times(this_00,0);
  testing::internal::MatcherBase<std::initializer_list<const_char_*>_>::~MatcherBase
            ((MatcherBase<std::initializer_list<const_char_*>_> *)&local_178.matchers_);
  testing::internal::MatcherBase<std::initializer_list<const_char_*>_>::~MatcherBase
            ((MatcherBase<std::initializer_list<const_char_*>_> *)&local_190);
  local_190.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<int_const&>::
       GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_190.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00198450;
  anon_unknown.dwarf_5c0ec::test_watch_thread::gmock_kill
            (&local_178,&local_158,(Matcher<const_int_&> *)&local_190);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(const_int_&)>::InternalExpectedAt
                      (&local_178,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                       ,0x99,"gc","kill (_)");
  testing::internal::TypedExpectation<void_(const_int_&)>::Times(this_01,0);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)&local_178.matchers_);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_190);
  local_190.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x0;
  local_178.function_mocker_ = (FunctionMocker<void_(const_int_&)> *)operator_new(0x10);
  ((local_178.function_mocker_)->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR___State_00198030;
  ((local_178.function_mocker_)->super_UntypedFunctionMockerBase).mock_obj_ = &local_158;
  std::thread::_M_start_thread(&local_190,&local_178,0);
  if (local_178.function_mocker_ != (FunctionMocker<void_(const_int_&)> *)0x0) {
    (*((local_178.function_mocker_)->super_UntypedFunctionMockerBase).
      _vptr_UntypedFunctionMockerBase[1])();
  }
  pstore::broker::gc_watch_thread::stop(&local_158.super_gc_watch_thread,-1);
  std::thread::join();
  if (local_190.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface == (_func_int **)0x0
     ) {
    local_158.super_gc_watch_thread._vptr_gc_watch_thread =
         (_func_int **)&PTR__test_watch_thread_00197fe8;
    testing::internal::FunctionMocker<void_(const_int_&)>::~FunctionMocker
              (&local_158.gmock01_kill_50);
    testing::internal::FunctionMocker<int_(std::initializer_list<const_char_*>)>::~FunctionMocker
              (&local_158.gmock01_spawn_49);
    pstore::broker::gc_watch_thread::~gc_watch_thread(&local_158.super_gc_watch_thread);
    return;
  }
  std::terminate();
}

Assistant:

TEST_F (Gc, Nothing) {
    test_watch_thread gc;
    EXPECT_CALL (gc, spawn (_)).Times (0);
    EXPECT_CALL (gc, kill (_)).Times (0);

    std::thread thread{[&gc] () { gc.watcher (); }};
    gc.stop ();
    thread.join ();
}